

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Format.h
# Opt level: O0

size_t Corrade::Utility::formatInto<unsigned_int>(MutableStringView *buffer,char *format,uint *args)

{
  size_t sVar1;
  undefined1 local_58 [8];
  BufferFormatter formatters [2];
  uint *args_local;
  char *format_local;
  MutableStringView *buffer_local;
  
  Implementation::BufferFormatter::BufferFormatter<unsigned_int>((BufferFormatter *)local_58,args);
  Implementation::BufferFormatter::BufferFormatter((BufferFormatter *)&formatters[0]._value);
  sVar1 = Implementation::formatFormatters(buffer,format,(BufferFormatter *)local_58,1);
  return sVar1;
}

Assistant:

std::size_t formatInto(const Containers::MutableStringView& buffer, const char* format, const Args&... args) {
    Implementation::BufferFormatter formatters[sizeof...(args) + 1] { Implementation::BufferFormatter{args}..., {} };
    return Implementation::formatFormatters(buffer, format, formatters, sizeof...(args));
}